

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

PathFindingOnMapCase * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<graph_tests::PathFindingOnMapCase>::Iterator::
Current(Iterator *this)

{
  pointer pPVar1;
  PathFindingOnMapCase *this_00;
  reference pPVar2;
  Iterator *this_local;
  
  pPVar1 = std::
           unique_ptr<const_graph_tests::PathFindingOnMapCase,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
           ::get(&this->value_);
  if (pPVar1 == (pointer)0x0) {
    this_00 = (PathFindingOnMapCase *)operator_new(0x20);
    pPVar2 = __gnu_cxx::
             __normal_iterator<const_graph_tests::PathFindingOnMapCase_*,_std::vector<graph_tests::PathFindingOnMapCase,_std::allocator<graph_tests::PathFindingOnMapCase>_>_>
             ::operator*(&this->iterator_);
    graph_tests::PathFindingOnMapCase::PathFindingOnMapCase(this_00,pPVar2);
    std::
    unique_ptr<const_graph_tests::PathFindingOnMapCase,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
    ::reset(&this->value_,this_00);
  }
  pPVar1 = std::
           unique_ptr<const_graph_tests::PathFindingOnMapCase,_std::default_delete<const_graph_tests::PathFindingOnMapCase>_>
           ::get(&this->value_);
  return pPVar1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }